

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O3

ivec4 ImageCodec::decodeSINT_SINTVec<short,2>(ImageCodec *param_1,void *ptr)

{
  ivec4 iVar1;
  
  iVar1.field_0._0_8_ = (ulong)CONCAT24(*(undefined2 *)((long)ptr + 2),(int)*ptr);
  iVar1.field_0._8_8_ = 0;
  return (ivec4)iVar1.field_0;
}

Assistant:

static glm::ivec4 decodeSINT_SINTVec(const ImageCodec*, const void* ptr) {
        static_assert(std::is_signed_v<TYPE>);
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const TYPE*>(ptr);
        glm::ivec4 result(0, 0, 0, 0);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = data[i];
        return result;
    }